

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O0

void charls::transform_line_to_quad<charls::transform_hp2<unsigned_char>::inverse,unsigned_char>
               (uchar *source,size_t pixel_stride_in,quad<unsigned_char> *destination,
               size_t pixel_stride,inverse *transform)

{
  ulong uVar1;
  triplet<unsigned_char> triplet_value;
  unsigned_long *puVar2;
  quad<unsigned_char> local_44;
  ulong uStack_40;
  quad<unsigned_char> pixel;
  size_t i;
  unsigned_long pixel_count;
  inverse *transform_local;
  size_t pixel_stride_local;
  quad<unsigned_char> *destination_local;
  size_t pixel_stride_in_local;
  uchar *source_local;
  
  transform_local = (inverse *)pixel_stride;
  pixel_stride_local = (size_t)destination;
  destination_local = (quad<unsigned_char> *)pixel_stride_in;
  pixel_stride_in_local = (size_t)source;
  puVar2 = std::min<unsigned_long>
                     ((unsigned_long *)&transform_local,(unsigned_long *)&destination_local);
  uVar1 = *puVar2;
  for (uStack_40 = 0; uStack_40 < uVar1; uStack_40 = uStack_40 + 1) {
    triplet_value =
         transform_hp2<unsigned_char>::inverse::operator()
                   (transform,(uint)*(byte *)(pixel_stride_in_local + uStack_40),
                    (uint)(&(destination_local->super_triplet<unsigned_char>).field_0)
                          [pixel_stride_in_local + uStack_40].v1,
                    (uint)*(byte *)(pixel_stride_in_local + uStack_40 + (long)destination_local * 2)
                   );
    quad<unsigned_char>::quad
              (&local_44,triplet_value,
               (uint)*(byte *)(pixel_stride_in_local + uStack_40 + (long)destination_local * 3));
    *(quad<unsigned_char> *)(pixel_stride_local + uStack_40 * 4) = local_44;
  }
  return;
}

Assistant:

void transform_line_to_quad(const PixelType* source, const size_t pixel_stride_in, quad<PixelType>* destination,
                            const size_t pixel_stride, Transform& transform) noexcept
{
    const auto pixel_count{std::min(pixel_stride, pixel_stride_in)};

    for (size_t i{}; i < pixel_count; ++i)
    {
        const quad<PixelType> pixel(transform(source[i], source[i + pixel_stride_in], source[i + 2 * pixel_stride_in]),
                                    source[i + 3 * pixel_stride_in]);
        destination[i] = pixel;
    }
}